

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yang_print_iffeature(lyout *out,int level,lys_module *module,lys_iffeature *iffeature)

{
  ly_print(out,"%*sif-feature \"",(ulong)(uint)(level * 2));
  ly_print_iffeature(out,module,iffeature,0);
  if (iffeature->ext_size != '\0') {
    ly_print(out,"\" {\n");
    yang_print_extension_instances
              (out,level + 1,module,LYEXT_SUBSTMT_SELF,'\0',iffeature->ext,(uint)iffeature->ext_size
              );
    ly_print(out,"%*s}\n",(ulong)(uint)(level * 2),"");
    return;
  }
  ly_print(out,"\";\n");
  return;
}

Assistant:

static void
yang_print_iffeature(struct lyout *out, int level, const struct lys_module *module, struct lys_iffeature *iffeature)
{
    ly_print(out, "%*sif-feature \"", LEVEL, INDENT);
    ly_print_iffeature(out, module, iffeature, 0);

    /* extensions */
    if (iffeature->ext_size) {
        ly_print(out, "\" {\n");
        yang_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_SELF, 0, iffeature->ext, iffeature->ext_size);
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    } else {
        ly_print(out, "\";\n");
    }
}